

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_SimQualityTest(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint in_EAX;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *__ptr;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uStack_38;
  
  iVar1 = p->vCis->nSize;
  if (10 < iVar1) {
    __assert_fail("Gia_ManCiNum(p) <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x659,"void Gia_SimQualityTest(Gia_Man_t *)");
  }
  uStack_38 = (ulong)in_EAX;
  uVar6 = 0;
  do {
    printf("%d : ",uVar6);
    Extra_PrintBinary(_stdout,(uint *)((long)&uStack_38 + 4),p->vCis->nSize);
    putchar(0x20);
    iVar2 = p->vCis->nSize;
    p_00 = (Vec_Int_t *)malloc(0x10);
    if (iVar2 - 1U < 0xf) {
      iVar2 = 0x10;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar2;
    if (iVar2 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)iVar2 << 2);
    }
    p_00->pArray = piVar3;
    if (0 < p->vCis->nSize) {
      uVar5 = 0;
      do {
        Vec_IntPush(p_00,(uint)((uStack_38._4_4_ >> (uVar5 & 0x1f) & 1) != 0));
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 < p->vCis->nSize);
    }
    __ptr = Gia_SimQualityOne(p,p_00,1);
    if ((long)__ptr->nSize < 1) {
      uVar6 = 0;
    }
    else {
      lVar4 = 0;
      uVar6 = 0;
      do {
        uVar6 = (ulong)(uint)((int)uVar6 + __ptr->pArray[lVar4]);
        lVar4 = lVar4 + 1;
      } while (__ptr->nSize != lVar4);
    }
    printf("%d ",uVar6);
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    putchar(10);
    uVar5 = uStack_38._4_4_ + 1;
    uVar6 = (ulong)uVar5;
    uStack_38 = CONCAT44(uVar5,(undefined4)uStack_38);
  } while ((int)uVar5 < 1 << ((byte)iVar1 & 0x1f));
  return;
}

Assistant:

void Gia_SimQualityTest( Gia_Man_t * p )
{
    Vec_Int_t * vPat, * vRes;
    int k, m, nMints = (1 << Gia_ManCiNum(p));
    assert( Gia_ManCiNum(p) <= 10 );
    for ( m = 0; m < nMints; m++ )
    {
        printf( "%d : ", m );
        Extra_PrintBinary( stdout, (unsigned*)&m, Gia_ManCiNum(p) );
        printf( " " );
        vPat = Vec_IntAlloc( Gia_ManCiNum(p) );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            Vec_IntPush( vPat, (m >> k) & 1 );
        vRes = Gia_SimQualityOne( p, vPat, 1 );
        printf( "%d ", Vec_IntSum(vRes) );
        Vec_IntFree( vRes );
        Vec_IntFree( vPat );
        printf( "\n" );
    }
}